

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O1

void nested_subflow(uint N)

{
  int *piVar1;
  U *pUVar2;
  _Head_base<0UL,_tf::Node_*,_false> _Var3;
  code *pcVar4;
  long *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  char extraout_AL;
  bool bVar11;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  int iVar12;
  Node *pNVar13;
  undefined8 *puVar14;
  __uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_> *p_Var15;
  ulong uVar16;
  lock_guard<std::mutex> lock;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pthread_mutex_t *ppVar17;
  mutex *__mutex;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Db;
  double dVar19;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 uVar20;
  future<void> fu;
  ResultBuilder DOCTEST_RB;
  future<void> fu_1;
  size_t num_tasks;
  Executor executor;
  Taskflow taskflow;
  Result local_328;
  undefined1 local_300 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f8;
  __uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
  local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  undefined2 local_2d8;
  anon_union_24_2_13149d16_for_String_2 local_2d0;
  anon_union_24_2_13149d16_for_String_2 aStack_2b8;
  bool local_2a0;
  char *local_298;
  char *local_290;
  __basic_future<void> local_288;
  anon_class_1_0_00000001 local_271;
  undefined1 local_270 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_260;
  shared_ptr<tf::WorkerInterface> local_258;
  Executor *local_248;
  undefined1 *local_240;
  Executor local_238;
  anon_class_8_1_69701ed9 local_100;
  undefined1 local_f8 [80];
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_90;
  bool local_38;
  
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_238,(ulong)N,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_f8._0_8_ = &local_a8;
  local_f8._8_8_ = 0;
  local_f8._16_8_ = 0;
  local_f8._24_8_ = 0;
  local_f8._32_8_ = (__pthread_internal_list *)0x0;
  local_f8._40_8_ = (__pthread_internal_list *)0x0;
  local_f8._48_8_ = local_f8 + 0x40;
  local_f8._56_8_ = 0;
  local_f8[0x40] = '\0';
  local_a8 = (pointer)0x0;
  puStack_a0 = (pointer)0x0;
  local_98 = (pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_90._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_90._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_90,0);
  uVar6 = local_f8._0_8_;
  local_38 = false;
  local_270._0_8_ = 0;
  local_300 = (undefined1  [8])operator_new(0xd8);
  *(undefined8 *)local_300 = 0;
  (((string *)((long)local_300 + 8))->_M_dataplus)._M_p = (pointer)((long)local_300 + 0x18);
  *(size_type *)((long)local_300 + 0x10) = 0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_300 + 0x18))->_M_local_buf[0] = '\0';
  *(void **)((long)local_300 + 0x28) = (void *)0x0;
  *(Topology **)((long)local_300 + 0x30) = (Topology *)0x0;
  *(Node **)((long)local_300 + 0x38) = (Node *)0x0;
  *(size_t *)((long)local_300 + 0x40) = 0;
  (((SmallVector<tf::Node_*,_4U> *)((long)local_300 + 0x48))->super_SmallVectorImpl<tf::Node_*>).
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = (U *)((long)local_300 + 0x60);
  *(U **)((long)local_300 + 0x50) = (U *)((long)local_300 + 0x60);
  *(atomic<unsigned_long> **)((long)local_300 + 0x58) =
       (atomic<unsigned_long> *)((long)local_300 + 0x80);
  (((atomic<unsigned_long> *)((long)local_300 + 0x80))->super___atomic_base<unsigned_long>)._M_i = 0
  ;
  *(undefined8 *)
   &(((handle_t *)((long)local_300 + 0x88))->
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ).
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)((long)local_300 + 0x90) = 0;
  *(undefined8 *)((long)local_300 + 0x98) = 0;
  *(element_type **)
   &(((handle_t *)((long)local_300 + 0x88))->
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ).
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = (element_type *)local_270;
  *(code **)((long)local_300 + 0xa0) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:441:20)>
       ::_M_invoke;
  *(code **)((long)local_300 + 0x98) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:441:20)>
       ::_M_manager;
  *(undefined8 *)((long)local_300 + 0xa8) = 0;
  *(undefined8 *)((long)local_300 + 0xb0) = 0;
  *(undefined8 *)((long)local_300 + 0xb8) = 0;
  *(__index_type *)((long)local_300 + 0xc0) = '\x03';
  (((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_> *)
   ((long)local_300 + 200))->_M_t).
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  ((exception_ptr *)((long)local_300 + 0xd0))->_M_exception_object = (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar6,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)local_300);
  if ((_Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>)local_300 != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)local_300,(Node *)local_300);
  }
  _Var3._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar6)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_300 = (undefined1  [8])&local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"sf-1","");
  std::__cxx11::string::_M_assign((string *)&(_Var3._M_head_impl)->_name);
  if (local_300 != (undefined1  [8])&local_2f0) {
    operator_delete((void *)local_300,
                    (ulong)((long)local_2f0._M_t.
                                  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
                                  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>
                                  ._M_head_impl + 1));
  }
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    local_2d0.buf[0] = '\0';
    local_2d0.buf[0x17] = '\x17';
    aStack_2b8.buf[0] = '\0';
    aStack_2b8.buf[0x17] = '\x17';
    local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
    local_2f8._M_pi._0_4_ = DT_REQUIRE_THROWS_WITH_AS;
    local_2f0._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
         (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
          )0x143e09;
    local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x1f9);
    local_2e0 = "executor.run_n(taskflow, 10).get()";
    local_2d8._0_1_ = true;
    local_2d8._1_1_ = false;
    local_2a0 = false;
    local_298 = "std::runtime_error";
    local_290 = "x";
    local_100.repeat = 10;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run_n(tf::Taskflow&,unsigned_long)::_lambda()_1_>
              ((Future<void> *)&local_328,&local_238,(Taskflow *)local_f8,&local_100,&local_271);
    std::future<void>::get((future<void> *)&local_328);
    plVar5 = (long *)CONCAT17(local_328.m_decomp.field_0.buf[0x17],local_328.m_decomp.field_0._16_7_
                             );
    dVar19 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if (plVar5 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar5 + 0xc);
        iVar12 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar12 = *(int *)((long)plVar5 + 0xc);
        *(int *)((long)plVar5 + 0xc) = iVar12 + -1;
      }
      dVar19 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      if (iVar12 == 1) {
        dVar19 = (double)(**(code **)(*plVar5 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr
                );
      dVar19 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
    dVar19 = doctest::detail::ResultBuilder::log((ResultBuilder *)local_300,dVar19);
    if (extraout_AL != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar19,0));
      return;
    }
    if (local_2d8._0_1_ == true) {
      bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
      if (bVar11) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_2b8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
    }
    if ((local_2d0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
    }
  }
  local_2d0.buf[0] = '\0';
  local_2d0.buf[0x17] = '\x17';
  aStack_2b8.buf[0] = '\0';
  aStack_2b8.buf[0x17] = '\x17';
  local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
  local_2f8._M_pi._0_4_ = DT_REQUIRE;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        )0x143e09;
  local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x1fa);
  local_2e0 = "num_tasks == 12";
  local_2d8._0_1_ = true;
  local_2d8._1_1_ = false;
  local_2a0 = false;
  local_298 = "";
  local_290 = "";
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0xc;
  local_270._8_4_ = 0xc;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_270;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const&> *)&local_288,(int *)(local_270 + 8));
  doctest::String::operator=((String *)&aStack_2b8.data,(String *)&local_328.m_decomp.field_0.data);
  local_2d8 = CONCAT11(local_2d8._1_1_,local_328.m_passed) ^ 1;
  uVar18 = extraout_XMM0_Da_01;
  uVar20 = extraout_XMM0_Db_01;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar18 = extraout_XMM0_Da_02;
    uVar20 = extraout_XMM0_Db_02;
  }
  dVar19 = doctest::detail::ResultBuilder::log
                     ((ResultBuilder *)local_300,(double)CONCAT44(uVar20,uVar18));
  if (extraout_AL_00 != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)(SUB84(dVar19,0));
    return;
  }
  if (local_2d8._0_1_ == true) {
    bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
    if (bVar11) {
      doctest::detail::throwException();
    }
  }
  if ((aStack_2b8.buf[0x17] < '\0') &&
     ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
  }
  if ((local_2d0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
  }
  local_270._0_8_ = 0;
  local_240 = local_f8;
  local_248 = &local_238;
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&local_238._topology_mutex);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  local_238._num_topologies = local_238._num_topologies + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&local_238._topology_mutex);
  std::__create_task_state<void(),nested_subflow(unsigned_int)::__1,std::allocator<int>>
            ((anon_class_16_2_465f4659_for__M_fn *)local_300,(allocator<int> *)&local_248);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)&local_328);
  _Var10._M_pi = local_2f8._M_pi;
  auVar9 = local_300;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_300;
  local_300 = (undefined1  [8])0x0;
  local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var10._M_pi;
  pNVar13 = (Node *)operator_new(0xd8);
  pNVar13->_nstate = 0;
  pNVar13->_estate = (__atomic_base<int>)0x0;
  (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
  (pNVar13->_name)._M_string_length = 0;
  (pNVar13->_name).field_2._M_local_buf[0] = '\0';
  pUVar2 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  pNVar13->_data = (void *)0x0;
  pNVar13->_topology = (Topology *)0x0;
  pNVar13->_parent = (Node *)0x0;
  pNVar13->_num_successors = 0;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &pNVar13->_join_counter;
  (pNVar13->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x18) = 0;
  puVar14 = (undefined8 *)operator_new(0x10);
  *puVar14 = 0;
  puVar14[1] = 0;
  *puVar14 = auVar9;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar14[1];
  puVar14[1] = _Var10._M_pi;
  *(undefined8 **)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = puVar14;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:87:7)>
       ::_M_invoke;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:87:7)>
       ::_M_manager;
  *(undefined1 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x20) = 0;
  *(__index_type *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\a';
  (pNVar13->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (pNVar13->_exception_ptr)._M_exception_object = (void *)0x0;
  if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
    uVar16 = (ulong)pNVar13 %
             (ulong)(((long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x5555555555555555);
    ppVar17 = (pthread_mutex_t *)
              (local_238._buffers._buckets.
               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16);
    iVar12 = pthread_mutex_lock(ppVar17);
    if (iVar12 != 0) {
      std::__throw_system_error(iVar12);
    }
    tf::UnboundedTaskQueue<tf::Node_*>::push
              (&local_238._buffers._buckets.
                super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].queue,pNVar13);
    pthread_mutex_unlock(ppVar17);
    tf::NonblockingNotifierV2::_notify<false>(&local_238._notifier);
  }
  else {
    tf::Executor::_schedule(&local_238,*(Worker **)(in_FS_OFFSET + -8),pNVar13);
  }
  std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)&local_288);
  local_270._8_8_ = local_328._0_8_;
  p_Stack_260 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr;
  std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)local_300);
  std::future<void>::get((future<void> *)(local_270 + 8));
  if (p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
  }
  local_2d0.buf[0] = '\0';
  local_2d0.buf[0x17] = '\x17';
  aStack_2b8.buf[0] = '\0';
  aStack_2b8.buf[0x17] = '\x17';
  local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
  local_2f8._M_pi._0_4_ = 0xc;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        )0x143e09;
  local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x203);
  local_2e0 = "num_tasks == 12";
  local_2d8._0_1_ = true;
  local_2d8._1_1_ = false;
  local_2a0 = false;
  local_298 = "";
  local_290 = "";
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0xc;
  local_270._8_4_ = 0xc;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_270;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const&> *)&local_288,(int *)(local_270 + 8));
  doctest::String::operator=((String *)&aStack_2b8.data,(String *)&local_328.m_decomp.field_0.data);
  local_2d8 = CONCAT11(local_2d8._1_1_,local_328.m_passed) ^ 1;
  uVar18 = extraout_XMM0_Da_03;
  uVar20 = extraout_XMM0_Db_03;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar18 = extraout_XMM0_Da_04;
    uVar20 = extraout_XMM0_Db_04;
  }
  dVar19 = doctest::detail::ResultBuilder::log
                     ((ResultBuilder *)local_300,(double)CONCAT44(uVar20,uVar18));
  if (extraout_AL_01 != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)(SUB84(dVar19,0));
    return;
  }
  if (local_2d8._0_1_ == true) {
    bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
    if (bVar11) {
      doctest::detail::throwException();
    }
  }
  if ((aStack_2b8.buf[0x17] < '\0') &&
     ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
  }
  if ((local_2d0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
  }
  local_270._0_8_ = 0;
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&local_238._topology_mutex);
  if (iVar12 != 0) {
LAB_001195ab:
    std::__throw_system_error(iVar12);
  }
  local_238._num_topologies = local_238._num_topologies + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&local_238._topology_mutex);
  pNVar13 = (Node *)operator_new(0xd8);
  pNVar13->_nstate = 0;
  pNVar13->_estate = (__atomic_base<int>)0x0;
  (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
  (pNVar13->_name)._M_string_length = 0;
  (pNVar13->_name).field_2._M_local_buf[0] = '\0';
  pUVar2 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  pNVar13->_data = (void *)0x0;
  pNVar13->_topology = (Topology *)0x0;
  pNVar13->_parent = (Node *)0x0;
  pNVar13->_num_successors = 0;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &pNVar13->_join_counter;
  (pNVar13->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(Executor **)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = &local_238;
  *(undefined1 **)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = local_f8;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:519:25)>
       ::_M_invoke;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:519:25)>
       ::_M_manager;
  *(undefined1 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x20) = 0;
  *(__index_type *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\a';
  (pNVar13->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (pNVar13->_exception_ptr)._M_exception_object = (void *)0x0;
  if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
    uVar16 = (ulong)pNVar13 %
             (ulong)(((long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x5555555555555555);
    ppVar17 = (pthread_mutex_t *)
              (local_238._buffers._buckets.
               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16);
    iVar12 = pthread_mutex_lock(ppVar17);
    if (iVar12 != 0) goto LAB_001195ab;
    tf::UnboundedTaskQueue<tf::Node_*>::push
              (&local_238._buffers._buckets.
                super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].queue,pNVar13);
    pthread_mutex_unlock(ppVar17);
    tf::NonblockingNotifierV2::_notify<false>(&local_238._notifier);
  }
  else {
    tf::Executor::_schedule(&local_238,*(Worker **)(in_FS_OFFSET + -8),pNVar13);
  }
  __mutex = &local_238._topology_mutex;
  local_2f8._M_pi = local_2f8._M_pi & 0xffffffffffffff00;
  local_300 = (undefined1  [8])__mutex;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_300);
  local_2f8._M_pi._0_1_ = 1;
  while (local_238._num_topologies != 0) {
    std::condition_variable::wait((unique_lock *)&local_238._topology_cv);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_300);
  local_2d0.buf[0] = '\0';
  local_2d0.buf[0x17] = '\x17';
  aStack_2b8.buf[0] = '\0';
  aStack_2b8.buf[0x17] = '\x17';
  local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
  local_2f8._M_pi._0_4_ = DT_REQUIRE;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        )0x143e09;
  local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x20b);
  local_2e0 = "num_tasks == 12";
  local_2d8._0_1_ = true;
  local_2d8._1_1_ = false;
  local_2a0 = false;
  local_298 = "";
  local_290 = "";
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0xc;
  local_270._8_4_ = 0xc;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_270;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const&> *)&local_288,(int *)(local_270 + 8));
  doctest::String::operator=((String *)&aStack_2b8.data,(String *)&local_328.m_decomp.field_0.data);
  local_2d8 = CONCAT11(local_2d8._1_1_,local_328.m_passed) ^ 1;
  uVar18 = extraout_XMM0_Da_05;
  uVar20 = extraout_XMM0_Db_05;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar18 = extraout_XMM0_Da_06;
    uVar20 = extraout_XMM0_Db_06;
  }
  dVar19 = doctest::detail::ResultBuilder::log
                     ((ResultBuilder *)local_300,(double)CONCAT44(uVar20,uVar18));
  if (extraout_AL_02 != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)(SUB84(dVar19,0));
    return;
  }
  if (local_2d8._0_1_ == true) {
    bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
    if (bVar11) {
      doctest::detail::throwException();
    }
  }
  if ((aStack_2b8.buf[0x17] < '\0') &&
     ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
  }
  if ((local_2d0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
  }
  local_270._0_8_ = 0;
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar12 != 0) {
    std::__throw_system_error(iVar12);
  }
  local_238._num_topologies = local_238._num_topologies + 1;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  std::promise<void>::promise((promise<void> *)&local_328);
  std::__basic_future<void>::__basic_future(&local_288,(__state_type *)&local_328);
  uVar8 = local_328.m_decomp.field_0._8_8_;
  uVar7 = local_328.m_decomp.field_0.data.ptr;
  uVar6 = local_328._0_8_;
  local_300 = (undefined1  [8])local_328._0_8_;
  local_328.m_decomp.field_0.data.ptr = (char *)0x0;
  local_328.m_decomp.field_0._8_8_ = (element_type *)0x0;
  local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  local_328._0_8_ = (element_type *)0x0;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)uVar8
  ;
  local_2e8 = local_f8;
  pNVar13 = (Node *)operator_new(0xd8);
  pNVar13->_nstate = 0;
  pNVar13->_estate = (__atomic_base<int>)0x40000000;
  (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
  (pNVar13->_name)._M_string_length = 0;
  (pNVar13->_name).field_2._M_local_buf[0] = '\0';
  pUVar2 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
            super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  pNVar13->_data = (void *)0x0;
  pNVar13->_topology = (Topology *)0x0;
  pNVar13->_parent = (Node *)0x0;
  pNVar13->_num_successors = 0;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar2;
  (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &pNVar13->_join_counter;
  (pNVar13->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x18) = 0;
  p_Var15 = (__uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_> *)operator_new(0x20);
  p_Var15->_M_t = (tuple<tf::Node_*,_std::default_delete<tf::Node>_>)uVar6;
  p_Var15[1]._M_t = (tuple<tf::Node_*,_std::default_delete<tf::Node>_>)0x0;
  local_2f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var15[1]._M_t = (tuple<tf::Node_*,_std::default_delete<tf::Node>_>)uVar7;
  local_300 = (undefined1  [8])0x0;
  p_Var15[2]._M_t = (tuple<tf::Node_*,_std::default_delete<tf::Node>_>)uVar8;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        )0x0;
  p_Var15[3]._M_t = (tuple<tf::Node_*,_std::default_delete<tf::Node>_>)local_f8;
  *(__uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_> **)
   &(pNVar13->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = p_Var15;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(tf::Runtime_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:67:7)>
       ::_M_invoke;
  *(code **)((long)&(pNVar13->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(tf::Runtime_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:67:7)>
       ::_M_manager;
  *(undefined1 *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x20) = 2;
  *(__index_type *)
   ((long)&(pNVar13->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\a';
  (pNVar13->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (pNVar13->_exception_ptr)._M_exception_object = (void *)0x0;
  if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
    uVar16 = (ulong)pNVar13 %
             (ulong)(((long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_238._buffers._buckets.
                            super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x5555555555555555);
    ppVar17 = (pthread_mutex_t *)
              (local_238._buffers._buckets.
               super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar16);
    iVar12 = pthread_mutex_lock(ppVar17);
    if (iVar12 != 0) {
      std::__throw_system_error(iVar12);
    }
    tf::UnboundedTaskQueue<tf::Node_*>::push
              (&local_238._buffers._buckets.
                super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].queue,pNVar13);
    pthread_mutex_unlock(ppVar17);
    tf::NonblockingNotifierV2::_notify<false>(&local_238._notifier);
  }
  else {
    tf::Executor::_schedule(&local_238,*(Worker **)(in_FS_OFFSET + -8),pNVar13);
  }
  std::promise<void>::~promise((promise<void> *)local_300);
  local_270._8_8_ =
       local_288._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_260 = local_288._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  std::promise<void>::~promise((promise<void> *)&local_328);
  std::future<void>::get((future<void> *)(local_270 + 8));
  if (p_Stack_260 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_260);
  }
  local_2d0.buf[0] = '\0';
  local_2d0.buf[0x17] = '\x17';
  aStack_2b8.buf[0] = '\0';
  aStack_2b8.buf[0x17] = '\x17';
  local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
  local_2f8._M_pi._0_4_ = 0xc;
  local_2f0._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
       (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
       (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
        )0x143e09;
  local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x212);
  local_2e0 = "num_tasks == 12";
  local_2d8._0_1_ = true;
  local_2d8._1_1_ = false;
  local_2a0 = false;
  local_298 = "";
  local_290 = "";
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0xc;
  local_270._8_4_ = 0xc;
  local_288._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_270;
  doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
            (&local_328,(Expression_lhs<unsigned_long_const&> *)&local_288,(int *)(local_270 + 8));
  doctest::String::operator=((String *)&aStack_2b8.data,(String *)&local_328.m_decomp.field_0.data);
  local_2d8 = CONCAT11(local_2d8._1_1_,local_328.m_passed) ^ 1;
  uVar18 = extraout_XMM0_Da_07;
  uVar20 = extraout_XMM0_Db_07;
  if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_328.m_decomp.field_0.data.ptr);
    uVar18 = extraout_XMM0_Da_08;
    uVar20 = extraout_XMM0_Db_08;
  }
  dVar19 = doctest::detail::ResultBuilder::log
                     ((ResultBuilder *)local_300,(double)CONCAT44(uVar20,uVar18));
  if (extraout_AL_03 != '\0') {
    pcVar4 = (code *)swi(3);
    (*pcVar4)(SUB84(dVar19,0));
    return;
  }
  if (local_2d8._0_1_ == true) {
    bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
    if (bVar11) {
      doctest::detail::throwException();
    }
  }
  if ((aStack_2b8.buf[0x17] < '\0') &&
     ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
  }
  if ((local_2d0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
  }
  local_270._0_8_ = 0;
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&local_238._topology_mutex);
  if (iVar12 == 0) {
    local_238._num_topologies = local_238._num_topologies + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&local_238._topology_mutex);
    pNVar13 = (Node *)operator_new(0xd8);
    pNVar13->_nstate = 0;
    pNVar13->_estate = (__atomic_base<int>)0x0;
    (pNVar13->_name)._M_dataplus._M_p = (pointer)&(pNVar13->_name).field_2;
    (pNVar13->_name)._M_string_length = 0;
    (pNVar13->_name).field_2._M_local_buf[0] = '\0';
    pUVar2 = &(pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    pNVar13->_data = (void *)0x0;
    pNVar13->_topology = (Topology *)0x0;
    pNVar13->_parent = (Node *)0x0;
    pNVar13->_num_successors = 0;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar2;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar2;
    (pNVar13->_edges).super_SmallVectorImpl<tf::Node_*>.
    super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &pNVar13->_join_counter;
    (pNVar13->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     &(pNVar13->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = 0;
    *(undefined8 *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(undefined8 *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x10) = 0;
    *(undefined1 **)
     &(pNVar13->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = local_f8;
    *(code **)((long)&(pNVar13->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:534:25)>
         ::_M_invoke;
    *(code **)((long)&(pNVar13->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:534:25)>
         ::_M_manager;
    *(undefined1 *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x20) = 1;
    *(__index_type *)
     ((long)&(pNVar13->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\a';
    (pNVar13->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (pNVar13->_exception_ptr)._M_exception_object = (void *)0x0;
    if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
      uVar16 = (ulong)pNVar13 %
               (ulong)(((long)local_238._buffers._buckets.
                              super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_238._buffers._buckets.
                              super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x5555555555555555)
      ;
      ppVar17 = (pthread_mutex_t *)
                (local_238._buffers._buckets.
                 super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar16);
      iVar12 = pthread_mutex_lock(ppVar17);
      if (iVar12 != 0) goto LAB_001195b2;
      tf::UnboundedTaskQueue<tf::Node_*>::push
                (&local_238._buffers._buckets.
                  super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].queue,pNVar13);
      pthread_mutex_unlock(ppVar17);
      tf::NonblockingNotifierV2::_notify<false>(&local_238._notifier);
    }
    else {
      tf::Executor::_schedule(&local_238,*(Worker **)(in_FS_OFFSET + -8),pNVar13);
    }
    local_300 = (undefined1  [8])&local_238._topology_mutex;
    local_2f8._M_pi = local_2f8._M_pi & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_300);
    local_2f8._M_pi._0_1_ = 1;
    while (local_238._num_topologies != 0) {
      std::condition_variable::wait((unique_lock *)&local_238._topology_cv);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_300);
    local_2d0.buf[0] = '\0';
    local_2d0.buf[0x17] = '\x17';
    aStack_2b8.buf[0] = '\0';
    aStack_2b8.buf[0x17] = '\x17';
    local_300 = *(undefined1 (*) [8])(doctest::detail::g_cs + 0x20);
    local_2f8._M_pi._0_4_ = DT_REQUIRE;
    local_2f0._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (tuple<std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>)
         (_Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
          )0x143e09;
    local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,0x21a);
    local_2e0 = "num_tasks == 12";
    local_2d8._0_1_ = true;
    local_2d8._1_1_ = false;
    local_2a0 = false;
    local_298 = "";
    local_290 = "";
    local_288._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = 0xc;
    local_270._8_4_ = 0xc;
    local_288._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_270;
    doctest::detail::Expression_lhs<unsigned_long_const&>::operator==
              (&local_328,(Expression_lhs<unsigned_long_const&> *)&local_288,(int *)(local_270 + 8))
    ;
    doctest::String::operator=
              ((String *)&aStack_2b8.data,(String *)&local_328.m_decomp.field_0.data);
    local_2d8 = CONCAT11(local_2d8._1_1_,local_328.m_passed) ^ 1;
    uVar18 = extraout_XMM0_Da_09;
    uVar20 = extraout_XMM0_Db_09;
    if ((local_328.m_decomp.field_0.buf[0x17] < '\0') &&
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328.m_decomp.field_0.data.ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      operator_delete__(local_328.m_decomp.field_0.data.ptr);
      uVar18 = extraout_XMM0_Da_10;
      uVar20 = extraout_XMM0_Db_10;
    }
    dVar19 = doctest::detail::ResultBuilder::log
                       ((ResultBuilder *)local_300,(double)CONCAT44(uVar20,uVar18));
    if (extraout_AL_04 != '\0') {
      pcVar4 = (code *)swi(3);
      (*pcVar4)(SUB84(dVar19,0));
      return;
    }
    if (local_2d8._0_1_ == true) {
      bVar11 = doctest::detail::checkIfShouldThrow((Enum)local_2f8._M_pi);
      if (bVar11) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_2b8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_2b8._1_7_,aStack_2b8.buf[0]));
    }
    if ((local_2d0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_2d0._1_7_,local_2d0.buf[0]));
    }
    tf::Taskflow::~Taskflow((Taskflow *)local_f8);
    tf::Executor::~Executor(&local_238);
    return;
  }
LAB_001195b2:
  std::__throw_system_error(iVar12);
}

Assistant:

void nested_subflow(unsigned N) {

  tf::Executor executor(N);
  tf::Taskflow taskflow;

  size_t num_tasks = 0;

  // level 1
  taskflow.emplace([&](tf::Subflow& sf1) {
    tf::Task V1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("V1");
    tf::Task W1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("W1");
    
    // level 2
    tf::Task X1 = sf1.emplace([&num_tasks](tf::Subflow& sf2){ 
      ++num_tasks; 

      tf::Task V2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("V2");
      tf::Task W2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("W2");
      
      // level 3
      tf::Task X2 = sf2.emplace([&num_tasks](tf::Subflow& sf3) {
        ++num_tasks;

        tf::Task V3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("V3");
        tf::Task W3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("W3");

        // level 4
        tf::Task X3 = sf3.emplace([&num_tasks](tf::Subflow& sf4){
          ++num_tasks;

          tf::Task V4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("V4");
          tf::Task W4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("W4");
          tf::Task X4 = sf4.emplace([&num_tasks](){ 
            ++num_tasks; 
            throw std::runtime_error("x");
          }).name("X4 (throw)");
          tf::Task Y4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("Y4");
          tf::Task Z4 = sf4.emplace([&num_tasks](){ ++num_tasks; }).name("Z4");

          V4.precede(W4);
          W4.precede(X4);
          X4.precede(Y4);
          Y4.precede(Z4);
        }).name("sf-4");

        tf::Task Y3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("Y3");
        tf::Task Z3 = sf3.emplace([&num_tasks](){ ++num_tasks; }).name("Z3");

        V3.precede(W3);
        W3.precede(X3);
        X3.precede(Y3);
        Y3.precede(Z3);
      }).name("sf3");

      tf::Task Y2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("Y2");
      tf::Task Z2 = sf2.emplace([&num_tasks](){ ++num_tasks; }).name("Z2");

      V2.precede(W2);
      W2.precede(X2);
      X2.precede(Y2);
      Y2.precede(Z2);
    }).name("sf-2");

    tf::Task Y1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("Y1");
    tf::Task Z1 = sf1.emplace([&num_tasks](){ ++num_tasks; }).name("Z1");

    V1.precede(W1);
    W1.precede(X1);
    X1.precede(Y1);
    Y1.precede(Z1);
  }).name("sf-1");

  REQUIRE_THROWS_WITH_AS(executor.run_n(taskflow, 10).get(), "x", std::runtime_error);
  REQUIRE(num_tasks == 12);
  
  //taskflow.dump(std::cout);

  // corun the nested subflow from an async task
  num_tasks = 0;
  executor.async([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow), "x", std::runtime_error);
  }).get(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an silent async task
  num_tasks = 0;
  executor.silent_async([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow), "x", std::runtime_error);
  });
  executor.wait_for_all(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an async task's runtime
  num_tasks = 0;
  executor.async([&](tf::Runtime& rt){
    REQUIRE_THROWS_WITH_AS(rt.corun(taskflow), "x", std::runtime_error);
  }).get(); 
  REQUIRE(num_tasks == 12);
  
  // corun the nested subflow from an silent-async task's runtime
  num_tasks = 0;
  executor.silent_async([&](tf::Runtime& rt){
    REQUIRE_THROWS_WITH_AS(rt.corun(taskflow), "x", std::runtime_error);
  });
  executor.wait_for_all(); 
  REQUIRE(num_tasks == 12);

}